

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reader.cpp
# Opt level: O1

string * __thiscall
ninx::lexer::Reader::read_identifier_abi_cxx11_
          (string *__return_storage_ptr__,Reader *this,int *trailing_spaces,int target_suffix,
          bool *found)

{
  pointer *ppcVar1;
  pointer pcVar2;
  iterator iVar3;
  bool *pbVar4;
  int *piVar5;
  string *psVar6;
  char cVar7;
  bool bVar8;
  allocator aVar9;
  int iVar10;
  int iVar11;
  LexerException *this_00;
  long lVar12;
  bool bVar13;
  char current;
  allocator local_75;
  int local_74;
  bool *local_70;
  int *local_68;
  string *local_60;
  vector<char,std::allocator<char>> *local_58;
  string local_50;
  
  pcVar2 = (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_finish != pcVar2) {
    (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar2;
  }
  local_58 = (vector<char,std::allocator<char>> *)&this->buffer;
  local_74 = target_suffix;
  local_70 = found;
  local_68 = trailing_spaces;
  local_60 = __return_storage_ptr__;
  do {
    if (((byte)this->stream[*(long *)(*(long *)this->stream + -0x18) + 0x20] & 5) != 0) break;
    cVar7 = std::istream::peek();
    iVar10 = isspace((int)cVar7);
    if (iVar10 != 0) break;
    lVar12 = 0;
    do {
      bVar8 = false;
      if ((&LIMITER_CHARS)[lVar12] == cVar7) {
        bVar8 = true;
        break;
      }
      bVar13 = lVar12 != 0x11;
      lVar12 = lVar12 + 1;
    } while (bVar13);
    if ((cVar7 != '_') && (bVar8)) break;
    aVar9 = (allocator)std::istream::get();
    local_75 = aVar9;
    if (aVar9 == (allocator)0xff) break;
    iVar10 = isalpha((int)(char)aVar9);
    if ((((int)(char)aVar9 - 0x3aU < 0xfffffff6 && iVar10 == 0) && (aVar9 != (allocator)0x2e)) &&
       (aVar9 != (allocator)0x5f)) {
      this_00 = (LexerException *)__cxa_allocate_exception(0x20);
      iVar10 = this->line_number;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Identifier can only contain alphanumeric characters.","");
      exception::LexerException::LexerException(this_00,iVar10,&this->origin,&local_50);
      __cxa_throw(this_00,&exception::LexerException::typeinfo,std::runtime_error::~runtime_error);
    }
    iVar3._M_current =
         (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                (local_58,iVar3,(char *)&local_75);
    }
    else {
      *iVar3._M_current = (char)aVar9;
      ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
  } while (aVar9 != (allocator)0xff);
  local_50._M_dataplus._M_p = local_50._M_dataplus._M_p & 0xffffffffffffff00;
  iVar3._M_current =
       (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage) {
    std::vector<char,_std::allocator<char>_>::_M_realloc_insert<char>
              ((vector<char,_std::allocator<char>_> *)local_58,iVar3,(char *)&local_50);
  }
  else {
    *iVar3._M_current = '\0';
    ppcVar1 = &(this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppcVar1 = *ppcVar1 + 1;
  }
  psVar6 = local_60;
  piVar5 = local_68;
  pbVar4 = local_70;
  iVar10 = local_74;
  *local_70 = false;
  if ((local_74 != -1) && (iVar11 = std::istream::peek(), iVar11 == iVar10)) {
    std::istream::get();
    *pbVar4 = true;
  }
  iVar10 = ignore_spaces(this);
  *piVar5 = iVar10;
  std::__cxx11::string::string
            ((string *)&local_50,
             (this->buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start,&local_75);
  (psVar6->_M_dataplus)._M_p = (pointer)&psVar6->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    (psVar6->field_2)._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
    *(undefined8 *)((long)&psVar6->field_2 + 8) = local_50.field_2._8_8_;
  }
  else {
    (psVar6->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
    (psVar6->field_2)._M_allocated_capacity = local_50.field_2._M_allocated_capacity;
  }
  psVar6->_M_string_length = local_50._M_string_length;
  return psVar6;
}

Assistant:

std::string ninx::lexer::Reader::read_identifier(int &trailing_spaces, int target_suffix, bool &found) {
    this->buffer.clear();

    while (stream) {
        // An identifier is valid until a space or a limiter is found
        char next_char = static_cast<char>(stream.peek());
        if (isspace(next_char) || (is_limiter(next_char) && next_char != '_')) {
            break;
        }

        // Read the current char
        char current = static_cast<char>(stream.get());
        if (current == -1) {
            break;
        }

        // If the current char is not alphanumeric, underscore or dot ( used to call nested methods and variables ),
        // raise an exception
        if (isalpha(current) == 0 && isdigit(current) == 0 && current != '.' && current != '_') {
            throw LexerException(this->line_number, this->origin,
                                 "Identifier can only contain alphanumeric characters.");
        }

        this->buffer.push_back(current);
    }

    this->buffer.push_back(0);

    found = false;
    if (target_suffix != -1 && stream.peek() == target_suffix) {
        stream.get();
        found = true;
    }

    trailing_spaces = ignore_spaces();

    return std::move(std::string{buffer.data()});
}